

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowPlaceholderObject(char *prefix,int uid)

{
  bool bVar1;
  uint in_ESI;
  undefined8 in_RDI;
  ImGuiTreeNodeFlags flags;
  int i;
  undefined4 in_stack_00000008;
  bool node_open;
  char *in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000024;
  float *in_stack_00000028;
  char *in_stack_00000030;
  uint flags_00;
  float in_stack_fffffffffffffff0;
  float row_min_height;
  
  ImGui::PushID(i);
  ImGui::TableNextRow(in_ESI,in_stack_fffffffffffffff0);
  ImGui::TableSetColumnIndex((int)in_stack_fffffffffffffff0);
  ImGui::AlignTextToFramePadding();
  bVar1 = ImGui::TreeNode("Object","%s_%u",in_RDI,(ulong)in_ESI);
  row_min_height = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffff0,0));
  ImGui::TableSetColumnIndex((int)row_min_height);
  ImGui::Text("my sailor is rich");
  if (((uint)row_min_height & 0x1000000) != 0) {
    for (flags_00 = 0; (int)flags_00 < 8; flags_00 = flags_00 + 1) {
      ImGui::PushID(i);
      if ((int)flags_00 < 2) {
        ShowPlaceholderObject((char *)CONCAT44(in_ESI,row_min_height),flags_00);
      }
      else {
        ImGui::TableNextRow(in_ESI,row_min_height);
        ImGui::TableSetColumnIndex((int)row_min_height);
        ImGui::AlignTextToFramePadding();
        ImGui::TreeNodeEx("Field",0x308,"Field_%d",(ulong)flags_00);
        ImGui::TableSetColumnIndex((int)row_min_height);
        ImGui::SetNextItemWidth(-1.1754944e-38);
        if ((int)flags_00 < 5) {
          ImGui::DragFloat(prefix,(float *)CONCAT44(uid,in_stack_00000008),(float)i,(float)flags,
                           (float)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,row_min_height),
                           flags_00);
        }
        else {
          ImGui::InputFloat(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
                            in_stack_00000018,prefix._4_4_);
        }
        ImGui::NextColumn();
      }
      ImGui::PopID();
    }
    ImGui::TreePop();
  }
  ImGui::PopID();
  return;
}

Assistant:

static void ShowPlaceholderObject(const char* prefix, int uid)
{
    // Use object uid as identifier. Most commonly you could also use the object pointer as a base ID.
    ImGui::PushID(uid);

    // Text and Tree nodes are less high than framed widgets, using AlignTextToFramePadding() we add vertical spacing to make the tree lines equal high.
    ImGui::TableNextRow();
    ImGui::TableSetColumnIndex(0);
    ImGui::AlignTextToFramePadding();
    bool node_open = ImGui::TreeNode("Object", "%s_%u", prefix, uid);
    ImGui::TableSetColumnIndex(1);
    ImGui::Text("my sailor is rich");

    if (node_open)
    {
        static float placeholder_members[8] = { 0.0f, 0.0f, 1.0f, 3.1416f, 100.0f, 999.0f };
        for (int i = 0; i < 8; i++)
        {
            ImGui::PushID(i); // Use field index as identifier.
            if (i < 2)
            {
                ShowPlaceholderObject("Child", 424242);
            }
            else
            {
                // Here we use a TreeNode to highlight on hover (we could use e.g. Selectable as well)
                ImGui::TableNextRow();
                ImGui::TableSetColumnIndex(0);
                ImGui::AlignTextToFramePadding();
                ImGuiTreeNodeFlags flags = ImGuiTreeNodeFlags_Leaf | ImGuiTreeNodeFlags_NoTreePushOnOpen | ImGuiTreeNodeFlags_Bullet;
                ImGui::TreeNodeEx("Field", flags, "Field_%d", i);

                ImGui::TableSetColumnIndex(1);
                ImGui::SetNextItemWidth(-FLT_MIN);
                if (i >= 5)
                    ImGui::InputFloat("##value", &placeholder_members[i], 1.0f);
                else
                    ImGui::DragFloat("##value", &placeholder_members[i], 0.01f);
                ImGui::NextColumn();
            }
            ImGui::PopID();
        }
        ImGui::TreePop();
    }
    ImGui::PopID();
}